

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hydro_ebgodunov.cpp
# Opt level: O2

void EBGodunov::ComputeAofs
               (MultiFab *aofs,int aofs_comp,int ncomp,MultiFab *state,int state_comp,MultiFab *umac
               ,MultiFab *vmac,MultiFab *wmac,MultiFab *xedge,MultiFab *yedge,MultiFab *zedge,
               int edge_comp,bool known_edgestate,MultiFab *xfluxes,MultiFab *yfluxes,
               MultiFab *zfluxes,int fluxes_comp,MultiFab *fq,int fq_comp,MultiFab *divu,
               Vector<amrex::BCRec,_std::allocator<amrex::BCRec>_> *h_bc,BCRec *d_bc,Geometry *geom,
               Vector<int,_std::allocator<int>_> *iconserv,Real dt,bool is_velocity,
               string redistribution_type)

{
  uint uVar1;
  BoxArray *bxs;
  Box *pBVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  pointer piVar9;
  EBCellFlagFab *pEVar10;
  Geometry geom_00;
  string redistribution_type_00;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined8 uVar13;
  bool bVar14;
  int j;
  FabType FVar15;
  FabType FVar16;
  uint uVar17;
  int iVar18;
  int iVar19;
  int iVar20;
  EBFArrayBoxFactory *this;
  FabArray<amrex::EBCellFlagFab> *pFVar21;
  MultiCutFab *pMVar22;
  FabArray<amrex::FArrayBox> *this_00;
  ulong uVar23;
  FabArray<amrex::EBCellFlagFab> *pFVar24;
  double *pdVar25;
  long lVar26;
  long lVar27;
  long lVar28;
  long lVar29;
  long lVar30;
  long lVar31;
  int *piVar32;
  int iVar33;
  int iVar34;
  size_t __n;
  long lVar35;
  long lVar36;
  long lVar37;
  Geometry *pGVar38;
  int iVar39;
  long lVar40;
  undefined8 *puVar41;
  long lVar42;
  ulong uVar43;
  int k_3;
  ulong uVar44;
  long lVar45;
  ulong uVar46;
  int k_2;
  ulong uVar47;
  int k_1;
  DistributionMapping *dm;
  double *pdVar48;
  int k;
  FabArray<amrex::FArrayBox> *pFVar49;
  Array4<const_double> *pAVar50;
  byte bVar51;
  undefined1 auVar53 [16];
  undefined8 uVar52;
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  Periodicity PVar59;
  undefined1 in_stack_fffffffffffff240 [64];
  undefined8 in_stack_fffffffffffff280;
  Array4<const_double> *in_stack_fffffffffffff288;
  Array4<const_double> *in_stack_fffffffffffff290;
  Array4<const_double> *in_stack_fffffffffffff298;
  Array4<const_double> *in_stack_fffffffffffff2a0;
  Array4<const_double> *in_stack_fffffffffffff2a8;
  Geometry *in_stack_fffffffffffff2b0;
  Vector<amrex::BCRec,_std::allocator<amrex::BCRec>_> *in_stack_fffffffffffff2b8;
  BCRec *in_stack_fffffffffffff2c0;
  int *in_stack_fffffffffffff2c8;
  undefined8 in_stack_fffffffffffff2d0;
  Array4<const_double> *in_stack_fffffffffffff2d8;
  Array4<double> *in_stack_fffffffffffff2e0;
  Array4<const_double> *in_stack_fffffffffffff2e8;
  Array4<const_double> *in_stack_fffffffffffff2f0;
  Array4<const_double> *in_stack_fffffffffffff2f8;
  Array4<const_double> *in_stack_fffffffffffff300;
  undefined1 is_velocity_00;
  long in_stack_fffffffffffff338;
  ulong in_stack_fffffffffffff340;
  Array4<const_double> *in_stack_fffffffffffff348;
  double *local_cb0;
  long local_ca8;
  long local_ca0;
  long local_c98;
  long local_c90;
  long local_c88;
  long local_c78;
  long local_c68;
  long local_c60;
  long local_c58;
  Box local_c4c;
  FabArray<amrex::FArrayBox> *local_c30;
  long local_c28;
  int local_c1c;
  long local_c18;
  double *local_c10;
  long local_c08;
  int *local_c00;
  Box result;
  int local_bdc;
  Dim3 local_bd8;
  ulong local_bcc;
  int local_bc4;
  Array4<const_double> local_b20;
  Array4<const_double> apz;
  Array4<const_double> apy;
  Array4<const_double> apx;
  Array4<double> local_a20;
  Real local_9e0;
  long local_9d8;
  long local_9d0;
  double *local_9c8;
  long local_9c0;
  long local_9b8;
  double *local_9b0;
  long local_9a8;
  double *local_9a0;
  long local_998;
  long local_990;
  long local_988;
  uint local_980 [2];
  long local_978;
  Long local_970;
  long local_968;
  Long local_960;
  long local_958;
  Long local_950;
  long local_948;
  int local_940;
  uint local_93c;
  Array4<const_amrex::EBCellFlag> local_938;
  undefined1 local_8f8 [32];
  int local_8d8;
  int local_8d4;
  int local_8d0;
  Array4<double> local_8b8;
  Array<const_MultiFab_*,_3> u;
  undefined1 local_860 [16];
  int local_850;
  Vector<int,_std::allocator<int>_> *local_838;
  Box result_1;
  int local_7f8;
  int iStack_7f4;
  Array4<const_double> local_7c0;
  Array4<double> advc_arr;
  undefined1 local_6c8 [32];
  Dim3 local_6a8;
  undefined1 local_69c [16];
  DeviceVector<int> iconserv_d;
  Array4<const_double> local_668;
  Elixir eli_1;
  int local_608;
  int local_604;
  int local_600;
  Array4<const_double> local_5e8;
  Array4<const_double> local_5a0;
  Array<const_MultiCutFab_*,_3> local_560;
  Array<const_MultiCutFab_*,_3> local_548;
  Array4<const_double> local_530;
  Array4<const_double> local_4f0;
  Elixir eli;
  Array4<const_double> fcz;
  Array4<const_double> fcy;
  Array4<const_double> fcx;
  undefined1 local_3d8 [16];
  undefined1 local_3c8 [16];
  Dim3 local_3b8;
  undefined1 local_3ac [16];
  string local_390 [32];
  Array4<const_amrex::EBCellFlag> local_370;
  MultiFab divu_mac;
  MultiFab advc;
  
  bVar51 = 0;
  local_c30 = &state->super_FabArray<amrex::FArrayBox>;
  local_c1c = state_comp;
  local_9e0 = dt;
  amrex::PODVector<int,_std::allocator<int>_>::PODVector
            (&iconserv_d,
             (long)(iconserv->super_vector<int,_std::allocator<int>_>).
                   super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                   _M_finish -
             (long)(iconserv->super_vector<int,_std::allocator<int>_>).
                   super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                   _M_start >> 2);
  piVar9 = (iconserv->super_vector<int,_std::allocator<int>_>).
           super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start;
  __n = (long)(iconserv->super_vector<int,_std::allocator<int>_>).
              super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
              _M_finish - (long)piVar9;
  if (__n != 0) {
    memcpy(iconserv_d.m_data,piVar9,__n);
  }
  local_c00 = iconserv_d.m_data;
  bVar14 = amrex::FabArray<amrex::FArrayBox>::hasEBFabFactory(local_c30);
  if (!bVar14) {
    amrex::Assert_host("state.hasEBFabFactory()",
                       "/workspace/llm4binary/github/license_c_cmakelists/AMReX-Combustion[P]PeleLM/Submodules/AMReX-Hydro/EBGodunov/hydro_ebgodunov.cpp"
                       ,0x34,(char *)0x0);
  }
  pFVar49 = local_c30;
  this = (EBFArrayBoxFactory *)
         __dynamic_cast((local_c30->m_factory)._M_t.
                        super___uniq_ptr_impl<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
                        .super__Head_base<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_false>.
                        _M_head_impl,&amrex::FabFactory<amrex::FArrayBox>::typeinfo,
                        &amrex::EBFArrayBoxFactory::typeinfo,0);
  if (this == (EBFArrayBoxFactory *)0x0) {
    __cxa_bad_cast();
  }
  pFVar21 = amrex::EBFArrayBoxFactory::getMultiEBCellFlagFab(this);
  amrex::EBFArrayBoxFactory::getFaceCent(&local_548,this);
  pMVar22 = amrex::EBFArrayBoxFactory::getCentroid(this);
  this_00 = &amrex::EBFArrayBoxFactory::getVolFrac(this)->super_FabArray<amrex::FArrayBox>;
  amrex::EBFArrayBoxFactory::getAreaFrac(&local_560,this);
  bxs = &(pFVar49->super_FabArrayBase).boxarray;
  dm = &(pFVar49->super_FabArrayBase).distributionMap;
  divu_mac.super_FabArray<amrex::FArrayBox>.super_FabArrayBase._vptr_FabArrayBase =
       (_func_int **)0x1;
  divu_mac.super_FabArray<amrex::FArrayBox>.super_FabArrayBase.boxarray.m_bat._0_16_ =
       (undefined1  [16])0x0;
  divu_mac.super_FabArray<amrex::FArrayBox>.super_FabArrayBase.boxarray.m_bat.m_op._12_16_ =
       (undefined1  [16])0x0;
  amrex::MultiFab::MultiFab
            (&advc,bxs,dm,ncomp,3,(MFInfo *)&divu_mac,(FabFactory<amrex::FArrayBox> *)this);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&divu_mac.super_FabArray<amrex::FArrayBox>.super_FabArrayBase.boxarray.m_bat.m_op.
                m_bndryReg.m_typ);
  amrex::FabArray<amrex::FArrayBox>::setVal<amrex::FArrayBox,_0>
            (&advc.super_FabArray<amrex::FArrayBox>,0.0);
  u._M_elems[0]._1_7_ = 0;
  u._M_elems[0]._0_1_ = 1;
  u._M_elems[1]._0_4_ = 0;
  u._M_elems[1]._4_4_ = 0;
  u._M_elems[2] = (MultiFab *)0x0;
  local_860 = (undefined1  [16])0x0;
  amrex::MultiFab::MultiFab(&divu_mac,bxs,dm,1,0,(MFInfo *)&u,(FabFactory<amrex::FArrayBox> *)this);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)(u._M_elems + 2));
  piVar9 = (iconserv->super_vector<int,_std::allocator<int>_>).
           super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start;
  lVar29 = (long)(iconserv->super_vector<int,_std::allocator<int>_>).
                 super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                 _M_finish - (long)piVar9 >> 2;
  lVar26 = 0;
  if (lVar29 < 1) {
    lVar29 = lVar26;
  }
  do {
    if (lVar29 == lVar26) goto LAB_002c83bc;
    piVar32 = piVar9 + lVar26;
    lVar26 = lVar26 + 1;
  } while (*piVar32 != 0);
  u._M_elems[0]._0_1_ = SUB81(umac,0);
  u._M_elems[0]._1_7_ = (undefined7)((ulong)umac >> 8);
  u._M_elems[2] = wmac;
  u._M_elems[1] = vmac;
  bVar14 = amrex::EBFArrayBoxFactory::isAllRegular(this);
  if (bVar14) {
    amrex::computeDivergence(&divu_mac,&u,geom);
  }
  else {
    amrex::EB_computeDivergence(&divu_mac,&u,geom,true);
  }
LAB_002c83bc:
  amrex::MFIter::MFIter((MFIter *)&u,(FabArrayBase *)aofs,true);
  local_940 = ncomp * 0xe;
  uVar23 = 0;
  if (0 < ncomp) {
    uVar23 = (ulong)(uint)ncomp;
  }
  while( true ) {
    if (local_850 <= (int)local_860._8_4_) break;
    amrex::MFIter::tilebox(&local_c4c,(MFIter *)&u);
    pFVar24 = amrex::EBFArrayBoxFactory::getMultiEBCellFlagFab(this);
    piVar32 = (int *)(local_860 + 8);
    if (local_838 != (Vector<int,_std::allocator<int>_> *)0x0) {
      piVar32 = (local_838->super_vector<int,_std::allocator<int>_>).
                super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                _M_start + (int)local_860._8_4_;
    }
    pEVar10 = (pFVar24->m_fabs_v).
              super__Vector_base<amrex::EBCellFlagFab_*,_std::allocator<amrex::EBCellFlagFab_*>_>.
              _M_impl.super__Vector_impl_data._M_start[*piVar32];
    result.btype.itype = local_c4c.bigend.vect[1];
    result.smallend.vect[2] = local_c4c.smallend.vect[2] + -3;
    result.bigend.vect[0] = local_c4c.bigend.vect[0] + 3;
    result.smallend.vect[1] = local_c4c.smallend.vect[1] - 3;
    result.smallend.vect[0] = local_c4c.smallend.vect[0] + -3;
    result.bigend.vect[1] = local_c4c.bigend.vect[1] + 3;
    result.bigend.vect[2] = local_c4c.bigend.vect[2] + 3;
    FVar15 = amrex::EBCellFlagFab::getType(pEVar10,&result);
    amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
              ((Array4<double> *)&local_938,&xfluxes->super_FabArray<amrex::FArrayBox>,(MFIter *)&u,
               fluxes_comp);
    amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
              (&local_a20,&yfluxes->super_FabArray<amrex::FArrayBox>,(MFIter *)&u,fluxes_comp);
    amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
              (&local_8b8,&zfluxes->super_FabArray<amrex::FArrayBox>,(MFIter *)&u,fluxes_comp);
    amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
              ((Array4<double> *)&apx,&xedge->super_FabArray<amrex::FArrayBox>,(MFIter *)&u,
               edge_comp);
    amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
              ((Array4<double> *)&apy,&yedge->super_FabArray<amrex::FArrayBox>,(MFIter *)&u,
               edge_comp);
    amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
              ((Array4<double> *)&apz,&zedge->super_FabArray<amrex::FArrayBox>,(MFIter *)&u,
               edge_comp);
    amrex::FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
              (&fcx,&umac->super_FabArray<amrex::FArrayBox>,(MFIter *)&u);
    amrex::FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
              (&fcy,&vmac->super_FabArray<amrex::FArrayBox>,(MFIter *)&u);
    amrex::FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
              (&fcz,&wmac->super_FabArray<amrex::FArrayBox>,(MFIter *)&u);
    amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
              (&advc_arr,&advc.super_FabArray<amrex::FArrayBox>,(MFIter *)&u);
    FVar16 = amrex::EBCellFlagFab::getType(pEVar10,&local_c4c);
    if (FVar16 == covered) {
      amrex::MFIter::nodaltilebox((Box *)&local_7c0,(MFIter *)&u,0);
      amrex::MFIter::nodaltilebox((Box *)&local_b20,(MFIter *)&u,1);
      amrex::MFIter::nodaltilebox((Box *)&local_4f0,(MFIter *)&u,2);
      amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                ((Array4<double> *)&result,&aofs->super_FabArray<amrex::FArrayBox>,(MFIter *)&u,
                 aofs_comp);
      auVar12 = _DAT_00601800;
      auVar11 = _DAT_006017f0;
      lVar29 = CONCAT44(result.bigend.vect[2],result.bigend.vect[1]) * 8;
      lVar36 = CONCAT44(result.bigend.vect[0],result.smallend.vect[2]) * 8;
      lVar26 = result.smallend.vect._0_8_ +
               ((long)local_c4c.smallend.vect[1] - (long)local_bd8.y) * lVar36 +
               ((long)local_c4c.smallend.vect[2] - (long)local_bd8.z) * lVar29 +
               (long)local_c4c.smallend.vect[0] * 8 + (long)local_bd8.x * -8 + 8;
      uVar17 = local_c4c.bigend.vect[0] - local_c4c.smallend.vect[0];
      auVar53._4_4_ = 0;
      auVar53._0_4_ = uVar17;
      auVar53._8_4_ = uVar17;
      auVar53._12_4_ = 0;
      auVar53 = auVar53 ^ _DAT_00601800;
      for (uVar46 = 0; lVar42 = lVar26, lVar27 = (long)local_c4c.smallend.vect[2], uVar46 != uVar23;
          uVar46 = uVar46 + 1) {
        for (; lVar28 = (long)local_c4c.smallend.vect[1], lVar30 = lVar42,
            lVar27 <= local_c4c.bigend.vect[2]; lVar27 = lVar27 + 1) {
          for (; lVar28 <= local_c4c.bigend.vect[1]; lVar28 = lVar28 + 1) {
            if (local_c4c.smallend.vect[0] <= local_c4c.bigend.vect[0]) {
              uVar44 = 0;
              do {
                auVar56._8_4_ = (int)uVar44;
                auVar56._0_8_ = uVar44;
                auVar56._12_4_ = (int)(uVar44 >> 0x20);
                auVar56 = (auVar56 | auVar11) ^ auVar12;
                bVar14 = auVar53._0_4_ < auVar56._0_4_;
                iVar20 = auVar53._4_4_;
                iVar19 = auVar56._4_4_;
                if ((bool)(~(iVar20 < iVar19 || iVar19 == iVar20 && bVar14) & 1)) {
                  *(undefined8 *)(lVar30 + -8 + uVar44 * 8) = 0x483d6329f1c35ca5;
                }
                if (iVar20 >= iVar19 && (iVar19 != iVar20 || !bVar14)) {
                  *(undefined8 *)(lVar30 + uVar44 * 8) = 0x483d6329f1c35ca5;
                }
                uVar44 = uVar44 + 2;
              } while (((ulong)uVar17 + 2 & 0x1fffffffe) != uVar44);
            }
            lVar30 = lVar30 + lVar36;
          }
          lVar42 = lVar42 + lVar29;
        }
        lVar26 = lVar26 + CONCAT44(local_bdc,result.btype.itype) * 8;
      }
      lVar29 = (long)local_7c0.p._4_4_;
      lVar36 = (long)(int)local_7c0.jstride;
      lVar42 = (long)apx.p +
               (lVar29 - apx.begin.y) * apx.jstride * 8 + (lVar36 - apx.begin.z) * apx.kstride * 8 +
               (long)(int)local_7c0.p * 8 + (long)apx.begin.x * -8;
      local_c18 = apx.nstride * 8;
      lVar26 = (long)&local_938.p[(long)local_938.begin.x * -2 + (long)(int)local_7c0.p * 2].flag +
               (lVar29 - local_938.begin.y) * local_938.jstride * 8 +
               (lVar36 - local_938.begin.z) * local_938.kstride * 8;
      local_c10 = (double *)(local_938.nstride * 8);
      for (uVar46 = 0; lVar27 = lVar26, lVar28 = lVar36, lVar30 = lVar42, uVar46 != uVar23;
          uVar46 = uVar46 + 1) {
        for (; lVar35 = lVar29, lVar37 = lVar27, lVar40 = lVar30, lVar28 <= local_7c0.kstride._4_4_;
            lVar28 = lVar28 + 1) {
          for (; lVar35 <= (int)local_7c0.kstride; lVar35 = lVar35 + 1) {
            if ((int)local_7c0.p <= local_7c0.jstride._4_4_) {
              lVar45 = 0;
              do {
                *(undefined8 *)(lVar37 + lVar45 * 8) = 0;
                *(undefined8 *)(lVar40 + lVar45 * 8) = 0x483d6329f1c35ca5;
                lVar45 = lVar45 + 1;
              } while ((local_7c0.jstride._4_4_ - (int)local_7c0.p) + 1 != (int)lVar45);
            }
            lVar40 = lVar40 + apx.jstride * 8;
            lVar37 = lVar37 + local_938.jstride * 8;
          }
          lVar27 = lVar27 + local_938.kstride * 8;
          lVar30 = lVar30 + apx.kstride * 8;
        }
        lVar42 = lVar42 + local_c18;
        lVar26 = lVar26 + (long)local_c10;
      }
      lVar26 = (long)local_b20.p._4_4_;
      lVar29 = (long)(int)local_b20.jstride;
      lVar42 = (long)apy.p +
               (lVar26 - apy.begin.y) * apy.jstride * 8 + (lVar29 - apy.begin.z) * apy.kstride * 8 +
               (long)(int)local_b20.p * 8 + (long)apy.begin.x * -8;
      local_c08 = apy.nstride * 8;
      lVar36 = (long)local_a20.p +
               (lVar26 - local_a20.begin.y) * local_a20.jstride * 8 +
               (lVar29 - local_a20.begin.z) * local_a20.kstride * 8 + (long)(int)local_b20.p * 8 +
               (long)local_a20.begin.x * -8;
      local_c28 = local_a20.nstride * 8;
      for (uVar46 = 0; lVar27 = lVar29, lVar28 = lVar36, lVar30 = lVar42, uVar46 != uVar23;
          uVar46 = uVar46 + 1) {
        for (; lVar35 = lVar26, lVar37 = lVar30, lVar40 = lVar28, lVar27 <= local_b20.kstride._4_4_;
            lVar27 = lVar27 + 1) {
          for (; lVar35 <= (int)local_b20.kstride; lVar35 = lVar35 + 1) {
            if ((int)local_b20.p <= local_b20.jstride._4_4_) {
              lVar45 = 0;
              do {
                *(undefined8 *)(lVar40 + lVar45 * 8) = 0;
                *(undefined8 *)(lVar37 + lVar45 * 8) = 0x483d6329f1c35ca5;
                lVar45 = lVar45 + 1;
              } while ((local_b20.jstride._4_4_ - (int)local_b20.p) + 1 != (int)lVar45);
            }
            lVar37 = lVar37 + apy.jstride * 8;
            lVar40 = lVar40 + local_a20.jstride * 8;
          }
          lVar28 = lVar28 + local_a20.kstride * 8;
          lVar30 = lVar30 + apy.kstride * 8;
        }
        lVar42 = lVar42 + local_c08;
        lVar36 = lVar36 + local_c28;
      }
      in_stack_fffffffffffff338 = (long)local_4f0.p._4_4_;
      lVar36 = (long)(int)local_4f0.jstride;
      in_stack_fffffffffffff340 = apz.kstride * 8;
      in_stack_fffffffffffff348 = (Array4<const_double> *)(local_8b8.kstride * 8);
      lVar29 = (in_stack_fffffffffffff338 - apz.begin.y) * apz.jstride * 8 +
               (lVar36 - apz.begin.z) * in_stack_fffffffffffff340 + (long)(int)local_4f0.p * 8 +
               (long)apz.begin.x * -8 + (long)apz.p;
      lVar26 = (in_stack_fffffffffffff338 - local_8b8.begin.y) * local_8b8.jstride * 8 +
               (lVar36 - local_8b8.begin.z) * (long)in_stack_fffffffffffff348 +
               (long)(int)local_4f0.p * 8 + (long)local_8b8.begin.x * -8 + (long)local_8b8.p;
      for (uVar46 = 0; lVar42 = lVar29, lVar27 = lVar26, lVar28 = lVar36, uVar46 != uVar23;
          uVar46 = uVar46 + 1) {
        for (; lVar30 = lVar27, lVar35 = in_stack_fffffffffffff338, lVar37 = lVar42,
            lVar28 <= local_4f0.kstride._4_4_; lVar28 = lVar28 + 1) {
          for (; lVar35 <= (int)local_4f0.kstride; lVar35 = lVar35 + 1) {
            if ((int)local_4f0.p <= local_4f0.jstride._4_4_) {
              lVar40 = 0;
              do {
                *(undefined8 *)(lVar30 + lVar40 * 8) = 0;
                *(undefined8 *)(lVar37 + lVar40 * 8) = 0x483d6329f1c35ca5;
                lVar40 = lVar40 + 1;
              } while ((local_4f0.jstride._4_4_ - (int)local_4f0.p) + 1 != (int)lVar40);
            }
            lVar37 = lVar37 + apz.jstride * 8;
            lVar30 = lVar30 + local_8b8.jstride * 8;
          }
          lVar42 = lVar42 + in_stack_fffffffffffff340;
          lVar27 = (long)&in_stack_fffffffffffff348->p + lVar27;
        }
        lVar29 = lVar29 + apz.nstride * 8;
        lVar26 = lVar26 + local_8b8.nstride * 8;
      }
    }
    else if (FVar15 == regular) {
      if (!known_edgestate) {
        amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                  ((Array4<const_double> *)&result,local_c30,(MFIter *)&u,local_c1c);
        amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                  (&local_7c0,&divu->super_FabArray<amrex::FArrayBox>,(MFIter *)&u);
        amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                  (&local_b20,&fq->super_FabArray<amrex::FArrayBox>,(MFIter *)&u,fq_comp);
        pGVar38 = geom;
        puVar41 = (undefined8 *)&stack0xfffffffffffff240;
        for (lVar26 = 0x19; lVar26 != 0; lVar26 = lVar26 + -1) {
          *puVar41 = *(undefined8 *)&pGVar38->super_CoordSys;
          pGVar38 = (Geometry *)((long)pGVar38 + (ulong)bVar51 * -0x10 + 8);
          puVar41 = puVar41 + (ulong)bVar51 * -2 + 1;
        }
        geom_00.super_CoordSys.inv_dx[1] = (Real)in_stack_fffffffffffff280;
        geom_00.super_CoordSys.c_sys = in_stack_fffffffffffff240._0_4_;
        geom_00.super_CoordSys._4_4_ = in_stack_fffffffffffff240._4_4_;
        geom_00.super_CoordSys.offset[0] = (Real)in_stack_fffffffffffff240._8_8_;
        geom_00.super_CoordSys.offset[1] = (Real)in_stack_fffffffffffff240._16_8_;
        geom_00.super_CoordSys.offset[2] = (Real)in_stack_fffffffffffff240._24_8_;
        geom_00.super_CoordSys.dx[0] = (Real)in_stack_fffffffffffff240._32_8_;
        geom_00.super_CoordSys.dx[1] = (Real)in_stack_fffffffffffff240._40_8_;
        geom_00.super_CoordSys.dx[2] = (Real)in_stack_fffffffffffff240._48_8_;
        geom_00.super_CoordSys.inv_dx[0] = (Real)in_stack_fffffffffffff240._56_8_;
        geom_00.super_CoordSys.inv_dx[2] = (Real)in_stack_fffffffffffff288;
        geom_00.super_CoordSys._80_8_ = in_stack_fffffffffffff290;
        geom_00.prob_domain.xlo[0] = (Real)in_stack_fffffffffffff298;
        geom_00.prob_domain.xlo[1] = (Real)in_stack_fffffffffffff2a0;
        geom_00.prob_domain.xlo[2] = (Real)in_stack_fffffffffffff2a8;
        geom_00.prob_domain.xhi[0] = (Real)in_stack_fffffffffffff2b0;
        geom_00.prob_domain.xhi[1] = (Real)in_stack_fffffffffffff2b8;
        geom_00.prob_domain.xhi[2] = (Real)in_stack_fffffffffffff2c0;
        geom_00.roundoff_hi_d.arr[0] = (double)in_stack_fffffffffffff2c8;
        geom_00.roundoff_hi_d.arr[1] = (double)in_stack_fffffffffffff2d0;
        geom_00.roundoff_hi_d.arr[2] = (double)in_stack_fffffffffffff2d8;
        geom_00.roundoff_hi_f.arr._0_8_ = in_stack_fffffffffffff2e0;
        geom_00._168_8_ = in_stack_fffffffffffff2e8;
        geom_00.domain.smallend.vect._4_8_ = in_stack_fffffffffffff2f0;
        geom_00.domain.bigend.vect._0_8_ = in_stack_fffffffffffff2f8;
        geom_00.domain._20_8_ = in_stack_fffffffffffff300;
        Godunov::ComputeEdgeState
                  (&local_c4c,ncomp,(Array4<const_double> *)&result,(Array4<double> *)&apx,
                   (Array4<double> *)&apy,(Array4<double> *)&apz,&fcx,&fcy,&fcz,&local_7c0,
                   &local_b20,geom_00,local_9e0,d_bc,local_c00,false,false,is_velocity);
      }
      result.smallend.vect._0_8_ = apx.p;
      result.smallend.vect[2] = (int)apx.jstride;
      result.bigend.vect[0] = (int)((ulong)apx.jstride >> 0x20);
      result.bigend.vect[1] = (int)apx.kstride;
      result.bigend.vect[2] = (int)((ulong)apx.kstride >> 0x20);
      result.btype.itype = (uint)apx.nstride;
      local_7c0.p = apy.p;
      local_7c0.jstride = apy.jstride;
      local_7c0.kstride = apy.kstride;
      local_7c0.nstride = apy.nstride;
      local_7c0.begin.z = apy.begin.z;
      local_7c0.end.z = apy.end.z;
      local_7c0.end.x = apy.end.x;
      local_7c0.end.y = apy.end.y;
      local_7c0.ncomp = apy.ncomp;
      local_b20.p = apz.p;
      local_b20.jstride = apz.jstride;
      local_b20.kstride = apz.kstride;
      local_b20.nstride = apz.nstride;
      local_b20.begin.z = apz.begin.z;
      local_b20.end.z = apz.end.z;
      local_b20.end.x = apz.end.x;
      local_b20.end.y = apz.end.y;
      local_b20.ncomp = apz.ncomp;
      in_stack_fffffffffffff2f8 = &fcz;
      in_stack_fffffffffffff2f0 = (Array4<const_double> *)0x2ca105;
      in_stack_fffffffffffff300 = (Array4<const_double> *)&result;
      HydroUtils::ComputeFluxes
                (&local_c4c,(Array4<double> *)&local_938,&local_a20,&local_8b8,&fcx,&fcy,
                 in_stack_fffffffffffff2f8,(Array4<const_double> *)&result,&local_7c0,&local_b20,
                 geom,ncomp,true);
      iVar20 = local_938.begin.z;
      uVar13 = local_938.begin._0_8_;
      result.smallend.vect._0_8_ = local_938.p;
      result.smallend.vect[2] = (int)local_938.jstride;
      result.bigend.vect[0] = (int)((ulong)local_938.jstride >> 0x20);
      result.bigend.vect[1] = (int)local_938.kstride;
      result.bigend.vect[2] = (int)((ulong)local_938.kstride >> 0x20);
      result.btype.itype = (uint)local_938.nstride;
      local_bdc = (int)((ulong)local_938.nstride >> 0x20);
      local_bd8.z = local_938.begin.z;
      local_bd8.x = local_938.begin.x;
      local_bd8.y = local_938.begin.y;
      uVar52 = local_bd8._0_8_;
      local_bc4 = local_938.end.z;
      local_bcc._0_4_ = local_938.end.x;
      local_bcc._4_4_ = local_938.end.y;
      local_7c0.p = local_a20.p;
      local_7c0.jstride = local_a20.jstride;
      local_7c0.kstride = local_a20.kstride;
      local_7c0.nstride = local_a20.nstride;
      local_7c0.begin.z = local_a20.begin.z;
      local_7c0.end.z = local_a20.end.z;
      local_7c0.end.x = local_a20.end.x;
      local_7c0.end.y = local_a20.end.y;
      local_7c0.ncomp = local_a20.ncomp;
      local_b20.p = local_8b8.p;
      local_b20.jstride = local_8b8.jstride;
      local_b20.kstride = local_8b8.kstride;
      local_b20.nstride = local_8b8.nstride;
      local_b20.begin.z = local_8b8.begin.z;
      local_b20.begin.y = local_8b8.begin.y;
      local_b20.begin.x = local_8b8.begin.x;
      local_b20.end.z = local_8b8.end.z;
      local_b20.end.x = local_8b8.end.x;
      local_b20.end.y = local_8b8.end.y;
      local_b20.ncomp = local_8b8.ncomp;
      HydroUtils::ComputeDivergence
                (&local_c4c,&advc_arr,(Array4<const_double> *)&result,&local_7c0,&local_b20,ncomp,
                 geom,-1.0,true);
      amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                ((Array4<double> *)&result,&divu_mac.super_FabArray<amrex::FArrayBox>,(MFIter *)&u);
      local_9a0 = apx.p;
      local_9a8 = apx.nstride;
      local_948 = (long)apx.begin.z;
      local_9b0 = apy.p;
      local_c28 = apy.jstride;
      local_950 = apy.kstride;
      local_9b8 = apy.nstride;
      in_stack_fffffffffffff348 = (Array4<const_double> *)(long)apy.begin.x;
      local_c08 = CONCAT44(local_c08._4_4_,apy.begin.y);
      local_958 = (long)apy.begin.z;
      local_c10 = apz.p;
      local_c18 = apz.jstride;
      local_960 = apz.kstride;
      local_9c0 = apz.nstride;
      in_stack_fffffffffffff340 = (ulong)apz.begin.x;
      local_968 = (long)apz.begin.z;
      local_9c8 = advc_arr.p;
      local_970 = advc_arr.kstride;
      local_9d0 = advc_arr.nstride;
      local_978 = (long)advc_arr.begin.z;
      local_980[0] = result.smallend.vect[0];
      local_980[1] = result.smallend.vect[1];
      local_988 = CONCAT44(result.bigend.vect[2],result.bigend.vect[1]);
      local_bd8.x = (int)uVar13;
      lVar26 = (long)local_bd8.x;
      local_bd8.y = SUB84(uVar13,4);
      lVar29 = (long)local_bd8.y;
      local_990 = (long)iVar20;
      local_998 = CONCAT44(local_998._4_4_,local_c4c.smallend.vect[1]);
      local_9d8 = (long)local_c4c.smallend.vect[2];
      for (uVar46 = 0; local_bd8._0_8_ = uVar52, uVar46 != uVar23; uVar46 = uVar46 + 1) {
        lVar36 = local_9d8;
        while (lVar36 <= local_c4c.bigend.vect[2]) {
          lVar42 = lVar36 + 1;
          lVar28 = (lVar36 - local_948) * apx.kstride;
          lVar30 = (lVar36 - local_958) * apy.kstride;
          in_stack_fffffffffffff338 = (lVar36 - local_968) * apz.kstride;
          lVar35 = lVar36 - local_990;
          lVar27 = (lVar36 - local_978) * advc_arr.kstride;
          uVar17 = local_c4c.smallend.vect[1];
          while (lVar36 = lVar42, (int)uVar17 <= local_c4c.bigend.vect[1]) {
            if (local_c4c.bigend.vect[0] < local_c4c.smallend.vect[0]) {
              uVar17 = uVar17 + 1;
            }
            else {
              iVar20 = local_c00[uVar46];
              lVar45 = (long)(int)uVar17;
              lVar37 = (lVar45 - apx.begin.y) * apx.jstride;
              iVar19 = uVar17 - apy.begin.y;
              uVar17 = uVar17 + 1;
              lVar40 = (lVar45 - apz.begin.y) * apz.jstride;
              lVar31 = (lVar45 - advc_arr.begin.y) * advc_arr.jstride;
              lVar36 = (long)local_c4c.smallend.vect[0];
              do {
                iVar18 = (int)lVar36;
                if (iVar20 == 0) {
                  advc_arr.p
                  [uVar46 * advc_arr.nstride + lVar27 + lVar31 + (lVar36 - advc_arr.begin.x)] =
                       ((apz.p[lVar40 + (lVar36 - in_stack_fffffffffffff340) +
                                        in_stack_fffffffffffff338 + uVar46 * apz.nstride] +
                         apz.p[lVar40 + (lVar36 - in_stack_fffffffffffff340) +
                                        ((int)lVar42 - apz.begin.z) * apz.kstride +
                                        uVar46 * apz.nstride] +
                        apx.p[uVar46 * apx.nstride + lVar28 + lVar37 + (lVar36 - apx.begin.x)] +
                        apx.p[uVar46 * apx.nstride + lVar28 + lVar37 + ((iVar18 + 1) - apx.begin.x)]
                        + apy.p[uVar46 * apy.nstride +
                                lVar30 + iVar19 * apy.jstride +
                                         (lVar36 - (long)in_stack_fffffffffffff348)] +
                        apy.p[uVar46 * apy.nstride +
                              lVar30 + (int)(uVar17 - apy.begin.y) * apy.jstride +
                                       (lVar36 - (long)in_stack_fffffffffffff348)]) / 6.0) *
                       *(double *)
                        (result.smallend.vect._0_8_ + lVar35 * local_988 * 8 +
                         (lVar45 - lVar29) * CONCAT44(result.bigend.vect[0],result.smallend.vect[2])
                         * 8 + (lVar36 - lVar26) * 8) +
                       advc_arr.p
                       [uVar46 * advc_arr.nstride + lVar27 + lVar31 + (lVar36 - advc_arr.begin.x)];
                }
                lVar36 = lVar36 + 1;
              } while (iVar18 + 1 != local_c4c.bigend.vect[0] + 1);
            }
          }
        }
      }
    }
    else {
      amrex::MultiCutFab::const_array(&local_7c0,local_548._M_elems[0],(MFIter *)&u);
      amrex::MultiCutFab::const_array(&local_b20,local_548._M_elems[1],(MFIter *)&u);
      amrex::MultiCutFab::const_array(&local_4f0,local_548._M_elems[2],(MFIter *)&u);
      amrex::MultiCutFab::const_array(&local_530,local_560._M_elems[0],(MFIter *)&u);
      amrex::MultiCutFab::const_array
                ((Array4<const_double> *)local_6c8,local_560._M_elems[1],(MFIter *)&u);
      amrex::MultiCutFab::const_array
                ((Array4<const_double> *)local_8f8,local_560._M_elems[2],(MFIter *)&u);
      amrex::MultiCutFab::const_array(&local_5e8,pMVar22,(MFIter *)&u);
      amrex::FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                ((Array4<const_double> *)&eli_1,this_00,(MFIter *)&u);
      amrex::FabArray<amrex::EBCellFlagFab>::const_array<amrex::EBCellFlagFab,_0>
                (&local_370,pFVar21,(MFIter *)&u);
      bVar14 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               redistribution_type._M_dataplus._M_p,"StateRedist");
      uVar17 = bVar14 | 4;
      result_1.smallend.vect[0] = local_c4c.smallend.vect[0] - uVar17;
      result_1.smallend.vect[1] = local_c4c.smallend.vect[1] - uVar17;
      result_1.smallend.vect[2] = local_c4c.smallend.vect[2] - uVar17;
      result_1.bigend.vect[0] = local_c4c.bigend.vect[0] + uVar17;
      result_1.bigend.vect[1] = (bVar14 | 4) + local_c4c.bigend.vect[1];
      result_1.bigend.vect[2] = (bVar14 | 4) + local_c4c.bigend.vect[2];
      amrex::FArrayBox::FArrayBox((FArrayBox *)&result,&result_1,local_940,true,false,(Arena *)0x0);
      amrex::BaseFab<double>::elixir<double,_0>(&eli,(BaseFab<double> *)&result);
      if (!known_edgestate) {
        is_velocity_00 = is_velocity;
        amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                  ((Array4<const_double> *)&result_1,local_c30,(MFIter *)&u,local_c1c);
        in_stack_fffffffffffff2a0 = &local_5a0;
        amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                  (in_stack_fffffffffffff2a0,&divu->super_FabArray<amrex::FArrayBox>,(MFIter *)&u);
        in_stack_fffffffffffff2a8 = &local_668;
        amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                  (in_stack_fffffffffffff2a8,&fq->super_FabArray<amrex::FArrayBox>,(MFIter *)&u,
                   fq_comp);
        pdVar25 = amrex::BaseFab<double>::dataPtr((BaseFab<double> *)&result,0);
        local_3c8 = (undefined1  [16])0x0;
        local_3d8 = (undefined1  [16])0x0;
        local_3b8.x = 1;
        local_3b8.y = 1;
        local_3b8.z = 1;
        local_3ac = (undefined1  [16])0x0;
        in_stack_fffffffffffff298 = &fcz;
        in_stack_fffffffffffff290 = &fcy;
        in_stack_fffffffffffff288 = &fcx;
        in_stack_fffffffffffff280 = 0x2c8933;
        in_stack_fffffffffffff2b0 = geom;
        in_stack_fffffffffffff2b8 = h_bc;
        in_stack_fffffffffffff2c0 = d_bc;
        in_stack_fffffffffffff2c8 = local_c00;
        ComputeEdgeState(&local_c4c,ncomp,(Array4<const_double> *)&result_1,(Array4<double> *)&apx,
                         (Array4<double> *)&apy,(Array4<double> *)&apz,in_stack_fffffffffffff288,
                         in_stack_fffffffffffff290,in_stack_fffffffffffff298,
                         in_stack_fffffffffffff2a0,in_stack_fffffffffffff2a8,geom,local_9e0,h_bc,
                         d_bc,local_c00,pdVar25,&local_370,&local_530,
                         (Array4<const_double> *)local_6c8,(Array4<const_double> *)local_8f8,
                         (Array4<const_double> *)&eli_1,&local_7c0,&local_b20,&local_4f0,&local_5e8,
                         (bool)is_velocity_00,(Array4<const_double> *)local_3d8);
      }
      result_1.smallend.vect[0] = (int)apx.p;
      result_1.smallend.vect[1] = (int)((ulong)apx.p >> 0x20);
      result_1.smallend.vect[2] = (int)apx.jstride;
      result_1.bigend.vect[0] = (int)((ulong)apx.jstride >> 0x20);
      result_1.bigend.vect[1] = (int)apx.kstride;
      result_1.bigend.vect[2] = (int)((ulong)apx.kstride >> 0x20);
      result_1.btype.itype = (uint)apx.nstride;
      local_5a0.p = apy.p;
      local_5a0.jstride = apy.jstride;
      local_5a0.kstride = apy.kstride;
      local_5a0.nstride = apy.nstride;
      local_5a0.begin.z = apy.begin.z;
      local_5a0.end.z = apy.end.z;
      local_5a0.end.x = apy.end.x;
      local_5a0.end.y = apy.end.y;
      local_5a0.ncomp = apy.ncomp;
      local_668.p = apz.p;
      local_668.jstride = apz.jstride;
      local_668.kstride = apz.kstride;
      local_668.nstride = apz.nstride;
      local_668.begin.z = apz.begin.z;
      local_668.end.z = apz.end.z;
      local_668.end.x = apz.end.x;
      local_668.end.y = apz.end.y;
      local_668.ncomp = apz.ncomp;
      in_stack_fffffffffffff300 = (Array4<const_double> *)local_6c8;
      in_stack_fffffffffffff2f8 = &local_530;
      in_stack_fffffffffffff2f0 = &local_668;
      in_stack_fffffffffffff2d8 = &fcz;
      in_stack_fffffffffffff2d0 = 0x2c8b08;
      in_stack_fffffffffffff2e0 = (Array4<double> *)&result_1;
      in_stack_fffffffffffff2e8 = &local_5a0;
      HydroUtils::EB_ComputeFluxes
                (&local_c4c,(Array4<double> *)&local_938,&local_a20,&local_8b8,&fcx,&fcy,
                 in_stack_fffffffffffff2d8,(Array4<const_double> *)&result_1,&local_5a0,
                 in_stack_fffffffffffff2f0,in_stack_fffffffffffff2f8,in_stack_fffffffffffff300,
                 (Array4<const_double> *)local_8f8,geom,ncomp,&local_370,true);
      iVar20 = local_938.begin.z;
      uVar52 = local_938.begin._0_8_;
      result_1.smallend.vect[0] = (int)local_938.p;
      result_1.smallend.vect[1] = (int)((ulong)local_938.p >> 0x20);
      result_1.smallend.vect[2] = (int)local_938.jstride;
      result_1.bigend.vect[0] = (int)((ulong)local_938.jstride >> 0x20);
      result_1.bigend.vect[1] = (int)local_938.kstride;
      result_1.bigend.vect[2] = (int)((ulong)local_938.kstride >> 0x20);
      result_1.btype.itype = (uint)local_938.nstride;
      local_5a0.p = local_a20.p;
      local_5a0.jstride = local_a20.jstride;
      local_5a0.kstride = local_a20.kstride;
      local_5a0.nstride = local_a20.nstride;
      local_5a0.begin.z = local_a20.begin.z;
      local_5a0.end.z = local_a20.end.z;
      local_5a0.end.x = local_a20.end.x;
      local_5a0.end.y = local_a20.end.y;
      local_5a0.ncomp = local_a20.ncomp;
      local_668.p = local_8b8.p;
      local_668.jstride = local_8b8.jstride;
      local_668.kstride = local_8b8.kstride;
      local_668.nstride = local_8b8.nstride;
      local_668.begin.z = local_8b8.begin.z;
      local_668.end.z = local_8b8.end.z;
      local_668.end.x = local_8b8.end.x;
      local_668.end.y = local_8b8.end.y;
      local_668.ncomp = local_8b8.ncomp;
      HydroUtils::EB_ComputeDivergence
                (&local_c4c,&advc_arr,(Array4<const_double> *)&result_1,&local_5a0,&local_668,
                 (Array4<const_double> *)&eli_1,ncomp,geom,-1.0,true);
      amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                ((Array4<double> *)&result_1,&divu_mac.super_FabArray<amrex::FArrayBox>,(MFIter *)&u
                );
      in_stack_fffffffffffff338 = (long)local_6a8.z;
      local_7f8 = (int)uVar52;
      lVar36 = (long)local_c4c.smallend.vect[0];
      lVar42 = (long)local_c4c.smallend.vect[2];
      local_9c0 = advc_arr.kstride * 8;
      local_9c8 = (double *)(CONCAT44(result_1.bigend.vect[2],result_1.bigend.vect[1]) * 8);
      local_9b8 = CONCAT44(local_8f8._20_4_,local_8f8._16_4_) * 8;
      lVar26 = ((lVar42 + 1) - (long)local_8d0) * local_9b8 + lVar36 * 8 + (long)local_8d8 * -8 +
               CONCAT44(local_8f8._4_4_,local_8f8._0_4_);
      local_9b0 = (double *)(apz.kstride * 8);
      local_998 = ((lVar42 + 1) - (long)apz.begin.z) * (long)local_9b0 + lVar36 * 8 +
                  (long)apz.begin.x * -8 + (long)apz.p;
      local_c08 = (lVar42 - apz.begin.z) * (long)local_9b0 + lVar36 * 8 + (long)apz.begin.x * -8 +
                  (long)apz.p;
      lVar29 = lVar42 - in_stack_fffffffffffff338;
      local_9a8 = local_6c8._16_8_ * 8;
      local_9d0 = apy.kstride * 8;
      local_9d8 = (long)eli_1.m_pa.
                        super_vector<std::pair<void_*,_amrex::Arena_*>,_std::allocator<std::pair<void_*,_amrex::Arena_*>_>_>
                        .
                        super__Vector_base<std::pair<void_*,_amrex::Arena_*>,_std::allocator<std::pair<void_*,_amrex::Arena_*>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage * 8;
      local_990 = (lVar42 - advc_arr.begin.z) * local_9c0 + lVar36 * 8 + (long)advc_arr.begin.x * -8
                  + (long)advc_arr.p;
      local_c10 = (double *)
                  ((lVar42 - apy.begin.z) * local_9d0 + lVar36 * 8 + (long)apy.begin.x * -8 +
                  (long)apy.p);
      local_c18 = (lVar42 - apx.begin.z) * apx.kstride * 8 + lVar36 * 8 + (long)apx.begin.x * -8 +
                  (long)apx.p;
      local_948 = CONCAT44(local_948._4_4_,local_530.begin.y);
      local_950 = CONCAT44(local_950._4_4_,apy.begin.y);
      local_958 = CONCAT44(local_958._4_4_,local_6a8.y);
      local_960 = CONCAT44(local_960._4_4_,apz.begin.y);
      local_968 = CONCAT44(local_968._4_4_,local_8d4);
      local_970 = CONCAT44(local_970._4_4_,advc_arr.begin.y);
      iStack_7f4 = SUB84(uVar52,4);
      local_978 = CONCAT44(local_978._4_4_,iStack_7f4);
      local_93c = local_c4c.smallend.vect[1];
      local_9a0 = (double *)(long)local_c4c.bigend.vect[2];
      local_980[0] = local_c4c.bigend.vect[1];
      for (uVar46 = 0; lVar27 = lVar42, local_cb0 = local_c10,
          local_ca8 = (lVar42 - local_600) * local_9d8 + lVar36 * 8 + (long)local_608 * -8 +
                      (long)eli_1.m_pa.
                            super_vector<std::pair<void_*,_amrex::Arena_*>,_std::allocator<std::pair<void_*,_amrex::Arena_*>_>_>
                            .
                            super__Vector_base<std::pair<void_*,_amrex::Arena_*>,_std::allocator<std::pair<void_*,_amrex::Arena_*>_>_>
                            ._M_impl.super__Vector_impl_data._M_start,
          local_ca0 = (lVar42 - local_530.begin.z) * local_530.kstride * 8 + lVar36 * 8 +
                      (long)local_530.begin.x * -8 + (long)local_530.p, local_c98 = local_c18,
          local_c90 = (lVar42 - iVar20) * (long)local_9c8 + lVar36 * 8 + (long)local_7f8 * -8 +
                      CONCAT44(result_1.smallend.vect[1],result_1.smallend.vect[0]),
          local_c88 = lVar29 * local_9a8 + lVar36 * 8 + (long)local_6a8.x * -8 + local_6c8._0_8_,
          local_c78 = local_990,
          local_c68 = (lVar42 - local_8d0) * local_9b8 + lVar36 * 8 + (long)local_8d8 * -8 +
                      CONCAT44(local_8f8._4_4_,local_8f8._0_4_), local_c60 = local_998,
          local_c58 = local_c08, local_c28 = lVar26, uVar46 != uVar23; uVar46 = uVar46 + 1) {
        while (lVar27 <= (long)local_9a0) {
          lVar27 = lVar27 + 1;
          uVar17 = local_c4c.smallend.vect[1];
          while ((int)uVar17 <= local_c4c.bigend.vect[1]) {
            if (local_c4c.bigend.vect[0] < local_c4c.smallend.vect[0]) {
              uVar17 = uVar17 + 1;
            }
            else {
              iVar19 = local_c00[uVar46];
              iVar18 = uVar17 - local_604;
              iVar33 = uVar17 - apy.begin.y;
              iVar34 = uVar17 - local_6a8.y;
              uVar1 = uVar17 + 1;
              in_stack_fffffffffffff340 = (ulong)uVar1;
              lVar37 = (long)(int)(uVar17 - apz.begin.y) * apz.jstride * 8;
              lVar35 = (long)(int)(uVar17 - local_8d4) *
                       CONCAT44(local_8f8._12_4_,local_8f8._8_4_) * 8;
              iVar39 = uVar17 - iStack_7f4;
              lVar30 = (long)(int)(uVar17 - advc_arr.begin.y) * advc_arr.jstride * 8 + local_c78;
              in_stack_fffffffffffff338 = local_c28 + lVar35;
              in_stack_fffffffffffff348 = (Array4<const_double> *)(local_c60 + lVar37);
              lVar45 = (long)(int)(uVar17 - local_530.begin.y) * local_530.jstride * 8 + local_ca0;
              lVar28 = (long)(int)(uVar17 - apx.begin.y) * apx.jstride * 8 + local_c98;
              lVar40 = 0;
              do {
                if ((iVar19 == 0) &&
                   ((dVar3 = *(double *)
                              ((long)iVar18 *
                               (long)eli_1.m_pa.
                                     super_vector<std::pair<void_*,_amrex::Arena_*>,_std::allocator<std::pair<void_*,_amrex::Arena_*>_>_>
                                     .
                                     super__Vector_base<std::pair<void_*,_amrex::Arena_*>,_std::allocator<std::pair<void_*,_amrex::Arena_*>_>_>
                                     ._M_impl.super__Vector_impl_data._M_finish * 8 + local_ca8 +
                              lVar40 * 8), dVar3 != 0.0 || (NAN(dVar3))))) {
                  dVar3 = *(double *)(lVar45 + lVar40 * 8);
                  dVar4 = *(double *)(lVar45 + 8 + lVar40 * 8);
                  dVar5 = *(double *)((long)iVar34 * local_6c8._8_8_ * 8 + local_c88 + lVar40 * 8);
                  dVar6 = *(double *)
                           ((long)(int)(uVar1 - local_6a8.y) * local_6c8._8_8_ * 8 + local_c88 +
                           lVar40 * 8);
                  dVar7 = *(double *)(lVar35 + local_c68 + lVar40 * 8);
                  dVar8 = *(double *)(in_stack_fffffffffffff338 + lVar40 * 8);
                  *(double *)(lVar30 + lVar40 * 8) =
                       ((*(double *)(lVar37 + local_c58 + lVar40 * 8) * dVar7 +
                         (double)(&in_stack_fffffffffffff348->p)[lVar40] * dVar8 +
                        *(double *)
                         ((long)local_cb0 +
                         lVar40 * 8 + (long)(int)(uVar1 - apy.begin.y) * apy.jstride * 8) * dVar6 +
                        *(double *)((long)local_cb0 + lVar40 * 8 + (long)iVar33 * apy.jstride * 8) *
                        dVar5 + *(double *)(lVar28 + lVar40 * 8) * dVar3 +
                                *(double *)(lVar28 + 8 + lVar40 * 8) * dVar4) /
                       (dVar3 + dVar4 + dVar5 + dVar6 + dVar7 + dVar8)) *
                       *(double *)
                        ((long)iVar39 *
                         CONCAT44(result_1.bigend.vect[0],result_1.smallend.vect[2]) * 8 + local_c90
                        + lVar40 * 8) + *(double *)(lVar30 + lVar40 * 8);
                }
                lVar40 = lVar40 + 1;
                uVar17 = uVar1;
              } while ((local_c4c.bigend.vect[0] - local_c4c.smallend.vect[0]) + 1 != (int)lVar40);
            }
          }
          local_c78 = local_c78 + local_9c0;
          local_c90 = local_c90 + (long)local_9c8;
          local_c28 = local_c28 + local_9b8;
          local_c68 = local_c68 + local_9b8;
          local_c60 = local_c60 + (long)local_9b0;
          local_c58 = local_c58 + (long)local_9b0;
          local_c88 = local_c88 + local_9a8;
          local_cb0 = local_cb0 + apy.kstride;
          local_ca8 = local_ca8 + local_9d8;
          local_ca0 = local_ca0 + local_530.kstride * 8;
          local_c98 = local_c98 + apx.kstride * 8;
          local_988 = lVar27;
        }
        local_990 = local_990 + advc_arr.nstride * 8;
        local_998 = local_998 + apz.nstride * 8;
        local_c08 = local_c08 + apz.nstride * 8;
        local_c10 = local_c10 + apy.nstride;
        local_c18 = local_c18 + apx.nstride * 8;
      }
      amrex::Gpu::Elixir::~Elixir(&eli);
      amrex::BaseFab<double>::~BaseFab((BaseFab<double> *)&result);
    }
    amrex::MFIter::operator++((MFIter *)&u);
  }
  amrex::MFIter::~MFIter((MFIter *)&u);
  PVar59 = amrex::Geometry::periodicity(geom);
  u._M_elems[0]._0_1_ = (undefined1)PVar59.period.vect[0];
  u._M_elems[0]._1_7_ = PVar59.period.vect._1_7_;
  u._M_elems[1]._0_4_ = PVar59.period.vect[2];
  amrex::FabArray<amrex::FArrayBox>::FillBoundary<double>
            (&advc.super_FabArray<amrex::FArrayBox>,(Periodicity *)&u,false);
  amrex::MFIter::MFIter((MFIter *)&u,(FabArrayBase *)aofs,true);
  do {
    if (local_850 <= (int)local_860._8_4_) {
      amrex::MFIter::~MFIter((MFIter *)&u);
      amrex::MultiFab::~MultiFab(&divu_mac);
      amrex::MultiFab::~MultiFab(&advc);
      amrex::PODVector<int,_std::allocator<int>_>::~PODVector(&iconserv_d);
      return;
    }
    amrex::MFIter::tilebox((Box *)local_8f8,(MFIter *)&u);
    pFVar21 = amrex::EBFArrayBoxFactory::getMultiEBCellFlagFab(this);
    piVar32 = (int *)(local_860 + 8);
    if (local_838 != (Vector<int,_std::allocator<int>_> *)0x0) {
      piVar32 = (local_838->super_vector<int,_std::allocator<int>_>).
                super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                _M_start + (int)local_860._8_4_;
    }
    pEVar10 = (pFVar21->m_fabs_v).
              super__Vector_base<amrex::EBCellFlagFab_*,_std::allocator<amrex::EBCellFlagFab_*>_>.
              _M_impl.super__Vector_impl_data._M_start[*piVar32];
    local_938.p = (pEVar10->super_BaseFab<amrex::EBCellFlag>).dptr;
    local_938.ncomp = (pEVar10->super_BaseFab<amrex::EBCellFlag>).nvar;
    pBVar2 = &(pEVar10->super_BaseFab<amrex::EBCellFlag>).domain;
    local_938.begin.z = (pEVar10->super_BaseFab<amrex::EBCellFlag>).domain.smallend.vect[2];
    local_938.begin.x = (pBVar2->smallend).vect[0];
    local_938.begin.y = (pBVar2->smallend).vect[1];
    lVar26 = (long)(pEVar10->super_BaseFab<amrex::EBCellFlag>).domain.bigend.vect[1] + 1;
    lVar29 = (long)(pEVar10->super_BaseFab<amrex::EBCellFlag>).domain.bigend.vect[0];
    lVar36 = (long)(pEVar10->super_BaseFab<amrex::EBCellFlag>).domain.bigend.vect[2] + 1;
    local_938.jstride = (lVar29 - (pBVar2->smallend).vect[0]) + 1;
    local_938.kstride =
         (lVar26 - (pEVar10->super_BaseFab<amrex::EBCellFlag>).domain.smallend.vect[1]) *
         local_938.jstride;
    local_938.nstride = (lVar36 - local_938.begin.z) * local_938.kstride;
    local_938.end._0_8_ = lVar29 + 1U & 0xffffffff | lVar26 << 0x20;
    local_938.end.z = (int)lVar36;
    amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
              (&local_a20,&aofs->super_FabArray<amrex::FArrayBox>,(MFIter *)&u,aofs_comp);
    amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
              (&local_8b8,&advc.super_FabArray<amrex::FArrayBox>,(MFIter *)&u);
    FVar15 = amrex::EBCellFlagFab::getType(pEVar10,(Box *)local_8f8);
    if (FVar15 != covered) {
      result.btype.itype = local_8f8._24_4_;
      result.smallend.vect[2] = local_8f8._8_4_ + -4;
      result.bigend.vect[0] = local_8f8._12_4_ + 4;
      result.smallend.vect[1] = local_8f8._4_4_ + -4;
      result.smallend.vect[0] = local_8f8._0_4_ + -4;
      result.bigend.vect[1] = local_8f8._16_4_ + 4;
      result.bigend.vect[2] = local_8f8._20_4_ + 4;
      FVar15 = amrex::EBCellFlagFab::getType(pEVar10,&result);
      auVar11 = _DAT_005fd980;
      if (FVar15 == regular) {
        in_stack_fffffffffffff338 = (long)(int)local_8f8._4_4_;
        lVar26 = (long)(int)local_8f8._8_4_;
        in_stack_fffffffffffff348 = (Array4<const_double> *)(local_a20.kstride * 8);
        local_c00 = (int *)(local_a20.nstride * 8);
        lVar29 = (in_stack_fffffffffffff338 - local_8b8.begin.y) * local_8b8.jstride * 8 +
                 (lVar26 - local_8b8.begin.z) * local_8b8.kstride * 8 +
                 (long)(int)local_8f8._0_4_ * 8 + (long)local_8b8.begin.x * -8 + (long)local_8b8.p;
        uVar46 = (in_stack_fffffffffffff338 - local_a20.begin.y) * local_a20.jstride * 8 +
                 (lVar26 - local_a20.begin.z) * (long)in_stack_fffffffffffff348 +
                 (long)(int)local_8f8._0_4_ * 8 + (long)local_a20.begin.x * -8 + (long)local_a20.p;
        in_stack_fffffffffffff340 = (long)local_8b8.begin.y;
        for (uVar44 = 0; uVar43 = uVar46, uVar46 = uVar43, lVar36 = lVar29, lVar42 = lVar26,
            uVar44 != uVar23; uVar44 = uVar44 + 1) {
          for (; lVar27 = in_stack_fffffffffffff338, uVar47 = uVar46, lVar28 = lVar36,
              lVar42 <= (int)local_8f8._20_4_; lVar42 = lVar42 + 1) {
            for (; lVar27 <= (int)local_8f8._16_4_; lVar27 = lVar27 + 1) {
              if ((int)local_8f8._0_4_ <= (int)local_8f8._12_4_) {
                lVar30 = 0;
                do {
                  *(ulong *)(uVar47 + lVar30 * 8) = *(ulong *)(lVar28 + lVar30 * 8) ^ auVar11._0_8_;
                  lVar30 = lVar30 + 1;
                } while ((local_8f8._12_4_ - local_8f8._0_4_) + 1 != (int)lVar30);
              }
              uVar47 = uVar47 + local_a20.jstride * 8;
              lVar28 = lVar28 + local_8b8.jstride * 8;
            }
            uVar46 = (long)&in_stack_fffffffffffff348->p + uVar46;
            lVar36 = lVar36 + local_8b8.kstride * 8;
          }
          lVar29 = lVar29 + local_8b8.nstride * 8;
          uVar46 = uVar43 + (long)local_c00;
          in_stack_fffffffffffff340 = uVar43;
        }
      }
      else {
        amrex::EBFArrayBoxFactory::getAreaFrac((Array<const_MultiCutFab_*,_3> *)&result,this);
        amrex::MultiCutFab::const_array(&apx,(MultiCutFab *)result.smallend.vect._0_8_,(MFIter *)&u)
        ;
        amrex::EBFArrayBoxFactory::getAreaFrac((Array<const_MultiCutFab_*,_3> *)&result,this);
        amrex::MultiCutFab::const_array
                  (&apy,(MultiCutFab *)CONCAT44(result.bigend.vect[0],result.smallend.vect[2]),
                   (MFIter *)&u);
        amrex::EBFArrayBoxFactory::getAreaFrac((Array<const_MultiCutFab_*,_3> *)&result,this);
        amrex::MultiCutFab::const_array
                  (&apz,(MultiCutFab *)CONCAT44(result.bigend.vect[2],result.bigend.vect[1]),
                   (MFIter *)&u);
        amrex::EBFArrayBoxFactory::getFaceCent((Array<const_MultiCutFab_*,_3> *)&result,this);
        amrex::MultiCutFab::const_array(&fcx,(MultiCutFab *)result.smallend.vect._0_8_,(MFIter *)&u)
        ;
        amrex::EBFArrayBoxFactory::getFaceCent((Array<const_MultiCutFab_*,_3> *)&result,this);
        amrex::MultiCutFab::const_array
                  (&fcy,(MultiCutFab *)CONCAT44(result.bigend.vect[0],result.smallend.vect[2]),
                   (MFIter *)&u);
        amrex::EBFArrayBoxFactory::getFaceCent((Array<const_MultiCutFab_*,_3> *)&result,this);
        amrex::MultiCutFab::const_array
                  (&fcz,(MultiCutFab *)CONCAT44(result.bigend.vect[2],result.bigend.vect[1]),
                   (MFIter *)&u);
        pMVar22 = amrex::EBFArrayBoxFactory::getCentroid(this);
        amrex::MultiCutFab::const_array((Array4<const_double> *)&advc_arr,pMVar22,(MFIter *)&u);
        amrex::FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                  (&local_7c0,this_00,(MFIter *)&u);
        local_5e8.p = (double *)CONCAT44(local_8f8._4_4_,local_8f8._0_4_);
        local_5e8.nstride._0_4_ = local_8f8._24_4_;
        local_5e8.kstride._4_4_ = local_8f8._20_4_;
        local_5e8.kstride._0_4_ = local_8f8._16_4_;
        local_5e8.jstride._0_4_ = local_8f8._8_4_;
        local_5e8.jstride._4_4_ = local_8f8._12_4_;
        bVar14 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)redistribution_type._M_dataplus._M_p,"StateRedist");
        if (bVar14) {
          iVar20 = (int)local_5e8.p + -3;
          uVar52 = 0x3fffffffd;
LAB_002cada6:
          iVar19 = (int)((ulong)uVar52 >> 0x20);
          local_5e8.jstride._0_4_ = (int)local_5e8.jstride + (int)uVar52;
          local_5e8.jstride._4_4_ = local_5e8.jstride._4_4_ + iVar19;
          local_5e8.kstride._0_4_ = (int)local_5e8.kstride + iVar19;
          local_5e8.p = (double *)CONCAT44(local_5e8.p._4_4_ + (int)uVar52,iVar20);
          local_5e8.kstride._4_4_ = local_5e8.kstride._4_4_ + iVar19;
        }
        else {
          bVar14 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)redistribution_type._M_dataplus._M_p,"FluxRedist");
          if (bVar14) {
            iVar20 = (int)local_5e8.p + -2;
            uVar52 = 0x2fffffffe;
            goto LAB_002cada6;
          }
        }
        pFVar49 = local_c30;
        amrex::FArrayBox::FArrayBox
                  ((FArrayBox *)&result,(Box *)&local_5e8,ncomp,true,false,(Arena *)0x0);
        amrex::BaseFab<double>::elixir<double,_0>(&eli_1,(BaseFab<double> *)&result);
        local_b20.p = (double *)CONCAT44(result.bigend.vect[2],result.bigend.vect[1]);
        local_b20.begin.y = local_bdc;
        local_b20.begin.x = result.btype.itype;
        local_b20.jstride = ((long)local_bd8.y - (long)(int)result.btype.itype) + 1;
        local_b20.kstride = (((long)local_bd8.z + 1) - (long)local_bdc) * local_b20.jstride;
        local_b20.nstride = (((long)(int)local_bcc + 1) - (long)local_bd8.x) * local_b20.kstride;
        local_b20.end._0_8_ = (long)local_bd8.y + 1U & 0xffffffff | (long)local_bd8.z + 1 << 0x20;
        local_b20.begin.z = local_bd8.x;
        local_b20.end.z = (int)((long)(int)local_bcc + 1);
        local_b20.ncomp = local_bc4;
        bVar14 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)redistribution_type._M_dataplus._M_p,"FluxRedist");
        auVar12 = _DAT_00601800;
        auVar11 = _DAT_006017f0;
        if (bVar14) {
          uVar17 = ~local_b20.begin.x + local_b20.end.x;
          auVar54._4_4_ = 0;
          auVar54._0_4_ = uVar17;
          auVar54._8_4_ = uVar17;
          auVar54._12_4_ = 0;
          pdVar25 = local_b20.p + 1;
          auVar54 = auVar54 ^ _DAT_00601800;
          for (lVar26 = (long)local_b20.begin.z; pdVar48 = pdVar25, lVar29 = (long)local_b20.begin.y
              , lVar26 < local_b20.end.z; lVar26 = lVar26 + 1) {
            for (; lVar29 <= (long)local_b20.end.y + -1; lVar29 = lVar29 + 1) {
              if (local_b20.begin.x < local_b20.end.x) {
                uVar46 = 0;
                do {
                  auVar57._8_4_ = (int)uVar46;
                  auVar57._0_8_ = uVar46;
                  auVar57._12_4_ = (int)(uVar46 >> 0x20);
                  auVar53 = (auVar57 | auVar11) ^ auVar12;
                  bVar14 = auVar54._0_4_ < auVar53._0_4_;
                  iVar20 = auVar54._4_4_;
                  iVar19 = auVar53._4_4_;
                  if ((bool)(~(iVar20 < iVar19 || iVar19 == iVar20 && bVar14) & 1)) {
                    pdVar48[uVar46 - 1] = 1.0;
                  }
                  if (iVar20 >= iVar19 && (iVar19 != iVar20 || !bVar14)) {
                    pdVar48[uVar46] = 1.0;
                  }
                  uVar46 = uVar46 + 2;
                } while (((ulong)uVar17 + 2 & 0x1fffffffe) != uVar46);
              }
              pdVar48 = pdVar48 + local_b20.jstride;
            }
            pdVar25 = pdVar25 + local_b20.kstride;
            pFVar49 = local_c30;
          }
        }
        amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                  ((Array4<double> *)&local_4f0,&advc.super_FabArray<amrex::FArrayBox>,(MFIter *)&u)
        ;
        amrex::FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                  (&local_530,pFVar49,(MFIter *)&u,local_c1c);
        std::__cxx11::string::string(local_390,(string *)redistribution_type._M_dataplus._M_p);
        local_6c8._16_16_ = (undefined1  [16])0x0;
        local_6c8._0_16_ = (undefined1  [16])0x0;
        local_6a8.x = 1;
        local_6a8.y = 1;
        local_6a8.z = 1;
        local_69c = (undefined1  [16])0x0;
        redistribution_type_00._M_string_length._0_4_ = 2;
        redistribution_type_00._M_dataplus._M_p = (pointer)local_390;
        redistribution_type_00._M_string_length._4_4_ = 0;
        redistribution_type_00.field_2._M_local_buf[0] = (char)local_6c8;
        redistribution_type_00.field_2._M_allocated_capacity._1_7_ = (int7)((ulong)local_6c8 >> 8);
        redistribution_type_00.field_2._8_8_ = in_stack_fffffffffffff338;
        Redistribution::Apply
                  ((Box *)local_8f8,ncomp,&local_a20,(Array4<double> *)&local_4f0,&local_530,
                   (Array4<double> *)&local_b20,&local_938,&apx,&apy,&apz,&local_7c0,&fcx,&fcy,&fcz,
                   (Array4<const_double> *)&advc_arr,d_bc,geom,local_9e0,redistribution_type_00,
                   (int)in_stack_fffffffffffff340,0.5,in_stack_fffffffffffff348);
        std::__cxx11::string::~string(local_390);
        auVar53 = _DAT_00601800;
        auVar12 = _DAT_006017f0;
        auVar11 = _DAT_005fd980;
        in_stack_fffffffffffff348 = (Array4<const_double> *)(long)(int)local_8f8._8_4_;
        uVar17 = local_8f8._12_4_ - local_8f8._0_4_;
        auVar55._4_4_ = 0;
        auVar55._0_4_ = uVar17;
        auVar55._8_4_ = uVar17;
        auVar55._12_4_ = 0;
        in_stack_fffffffffffff340 = local_a20.nstride * 8;
        lVar26 = (long)local_a20.p +
                 ((long)(int)local_8f8._4_4_ - (long)local_a20.begin.y) * local_a20.jstride * 8 +
                 ((long)in_stack_fffffffffffff348 - (long)local_a20.begin.z) * local_a20.kstride * 8
                 + (long)(int)local_8f8._0_4_ * 8 + (long)local_a20.begin.x * -8 + 8;
        for (uVar46 = 0; lVar29 = lVar26, lVar26 = lVar29, pAVar50 = in_stack_fffffffffffff348,
            uVar46 != uVar23; uVar46 = uVar46 + 1) {
          for (; lVar36 = (long)(int)local_8f8._4_4_, lVar42 = lVar26,
              (long)pAVar50 <= (long)(int)local_8f8._20_4_;
              pAVar50 = (Array4<const_double> *)((long)&pAVar50->p + 1)) {
            for (; lVar36 <= (int)local_8f8._16_4_; lVar36 = lVar36 + 1) {
              if ((int)local_8f8._0_4_ <= (int)local_8f8._12_4_) {
                uVar44 = 0;
                do {
                  auVar58._8_4_ = (int)uVar44;
                  auVar58._0_8_ = uVar44;
                  auVar58._12_4_ = (int)(uVar44 >> 0x20);
                  auVar54 = auVar55 ^ auVar53;
                  auVar56 = (auVar58 | auVar12) ^ auVar53;
                  bVar14 = auVar54._0_4_ < auVar56._0_4_;
                  iVar20 = auVar54._4_4_;
                  iVar19 = auVar56._4_4_;
                  if ((bool)(~(iVar20 < iVar19 || iVar19 == iVar20 && bVar14) & 1)) {
                    *(ulong *)(lVar42 + -8 + uVar44 * 8) =
                         *(ulong *)(lVar42 + -8 + uVar44 * 8) ^ auVar11._0_8_;
                  }
                  if (iVar20 >= iVar19 && (iVar19 != iVar20 || !bVar14)) {
                    *(ulong *)(lVar42 + uVar44 * 8) =
                         *(ulong *)(lVar42 + uVar44 * 8) ^ auVar11._0_8_;
                  }
                  uVar44 = uVar44 + 2;
                } while (((ulong)uVar17 + 2 & 0x1fffffffe) != uVar44);
              }
              lVar42 = lVar42 + local_a20.jstride * 8;
            }
            lVar26 = lVar26 + local_a20.kstride * 8;
          }
          lVar26 = lVar29 + in_stack_fffffffffffff340;
          in_stack_fffffffffffff338 = lVar29;
        }
        amrex::Gpu::Elixir::~Elixir(&eli_1);
        amrex::BaseFab<double>::~BaseFab((BaseFab<double> *)&result);
      }
    }
    amrex::MFIter::operator++((MFIter *)&u);
  } while( true );
}

Assistant:

void
EBGodunov::ComputeAofs ( MultiFab& aofs, const int aofs_comp, const int ncomp,
                         MultiFab const& state, const int state_comp,
                         AMREX_D_DECL( MultiFab const& umac,
                                       MultiFab const& vmac,
                                       MultiFab const& wmac),
                         AMREX_D_DECL( MultiFab& xedge,
                                       MultiFab& yedge,
                                       MultiFab& zedge),
                         const int  edge_comp,
                         const bool known_edgestate,
                         AMREX_D_DECL( MultiFab& xfluxes,
                                       MultiFab& yfluxes,
                                       MultiFab& zfluxes),
                         int fluxes_comp,
                         MultiFab const& fq,
                         const int fq_comp,
                         MultiFab const& divu,
                         Vector<BCRec> const& h_bc,
                         BCRec const* d_bc,
                         Geometry const& geom,
                         Vector<int>& iconserv,
                         const Real dt,
                         const bool is_velocity,
                         std::string redistribution_type)
{
    BL_PROFILE("EBGodunov::ComputeAofs()");

    bool fluxes_are_area_weighted = true;

    // Make a device copy of the iconserv vector for use in kernels
    Gpu::DeviceVector<int> iconserv_d(iconserv.size());
    Gpu::copy(Gpu::hostToDevice, iconserv.begin(), iconserv.end(), iconserv_d.begin());
    int const* iconserv_ptr = iconserv_d.data();

    AMREX_ALWAYS_ASSERT(state.hasEBFabFactory());

    auto const& ebfact= dynamic_cast<EBFArrayBoxFactory const&>(state.Factory());
    auto const& flags = ebfact.getMultiEBCellFlagFab();
    auto const& fcent = ebfact.getFaceCent();
    auto const& ccent = ebfact.getCentroid();
    auto const& vfrac = ebfact.getVolFrac();
    auto const& areafrac = ebfact.getAreaFrac();

    // Create temporary holder for advection term. Needed so we can call FillBoundary.
    MultiFab advc(state.boxArray(),state.DistributionMap(),ncomp,3,MFInfo(),ebfact);
    advc.setVal(0.);

    // if we need convective form, we must also compute
    // div(u_mac)
    MultiFab divu_mac(state.boxArray(),state.DistributionMap(),1,0, MFInfo(), ebfact);
    for (Long i = 0; i < iconserv.size(); ++i)
    {
        if (!iconserv[i])
        {
            Array<MultiFab const*,AMREX_SPACEDIM> u;
            AMREX_D_TERM(u[0] = &umac;,
                         u[1] = &vmac;,
                         u[2] = &wmac;);

            if (!ebfact.isAllRegular())
                amrex::EB_computeDivergence(divu_mac,u,geom,true);
            else
                amrex::computeDivergence(divu_mac,u,geom);

            break;
        }
    }

    // Compute -div instead of computing div -- this is just for consistency
    // with the way we HAVE to do it for EB (because redistribution operates on
    // -div rather than div
    Real mult = -1.0;

#ifdef _OPENMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
    for (MFIter mfi(aofs, TilingIfNotGPU()); mfi.isValid(); ++mfi)
    {

        const Box& bx   = mfi.tilebox();

        auto const& flagfab = ebfact.getMultiEBCellFlagFab()[mfi];
    // A regular box uses 3 ghost cells:
    // We predict the state on the edge based box; that calls slopes on
    // i & i-1; slopes then looks at (i-1)-2 for 4th order slopes
    // => test on bx grow 3
        bool regular = (flagfab.getType(amrex::grow(bx,3)) == FabType::regular);

        // Get handlers to Array4
        //
        AMREX_D_TERM( const auto& fx = xfluxes.array(mfi,fluxes_comp);,
                      const auto& fy = yfluxes.array(mfi,fluxes_comp);,
                      const auto& fz = zfluxes.array(mfi,fluxes_comp););

        AMREX_D_TERM( const auto& xed = xedge.array(mfi,edge_comp);,
                      const auto& yed = yedge.array(mfi,edge_comp);,
                      const auto& zed = zedge.array(mfi,edge_comp););

        AMREX_D_TERM( const auto& u = umac.const_array(mfi);,
                      const auto& v = vmac.const_array(mfi);,
                      const auto& w = wmac.const_array(mfi););

    Array4<Real> advc_arr = advc.array(mfi);

        if (flagfab.getType(bx) == FabType::covered)
        {
        AMREX_D_TERM( const Box& xbx = mfi.nodaltilebox(0);,
              const Box& ybx = mfi.nodaltilebox(1);,
              const Box& zbx = mfi.nodaltilebox(2); );

            auto const& aofs_arr = aofs.array(mfi, aofs_comp);

            amrex::ParallelFor(
                bx, ncomp, [aofs_arr] AMREX_GPU_DEVICE (int i, int j, int k, int n) noexcept
                { aofs_arr( i, j, k, n ) = covered_val;},

                xbx, ncomp, [fx,xed] AMREX_GPU_DEVICE (int i, int j, int k, int n) noexcept
                { fx( i, j, k, n ) = 0.0; xed( i, j, k, n ) = covered_val;},

                ybx, ncomp, [fy,yed] AMREX_GPU_DEVICE (int i, int j, int k, int n) noexcept
                { fy( i, j, k, n ) = 0.0; yed( i, j, k, n ) = covered_val;});

#if (AMREX_SPACEDIM==3)
            amrex::ParallelFor(
                zbx, ncomp, [fz,zed]AMREX_GPU_DEVICE (int i, int j, int k, int n) noexcept
                { fz( i, j, k, n ) = 0.0; zed( i, j, k, n ) = covered_val;});
#endif
        }
        else
        {
        if (regular)   // Plain Godunov
        {
            if (!known_edgestate)
            {
                Godunov::ComputeEdgeState( bx, ncomp,
                                           state.array(mfi,state_comp),
                                           AMREX_D_DECL( xed, yed, zed ),
                                           AMREX_D_DECL( u, v, w ),
                                           divu.array(mfi),
                                           fq.array(mfi,fq_comp),
                                           geom, dt, d_bc,
                                           iconserv_ptr,
                                           false,
                                           false,
                                           is_velocity );
            }

            HydroUtils::ComputeFluxes( bx,
                                       AMREX_D_DECL( fx, fy, fz ),
                                       AMREX_D_DECL( u, v, w ),
                                       AMREX_D_DECL( xed, yed, zed ),
                                       geom, ncomp, fluxes_are_area_weighted );

            HydroUtils::ComputeDivergence( bx, advc_arr,
                                           AMREX_D_DECL( fx, fy, fz ),
                                           ncomp, geom,
                                           mult, fluxes_are_area_weighted);

            // Compute the convective form if needed by accounting for extra term
            auto const& divu_arr  = divu_mac.array(mfi);
            amrex::ParallelFor(bx, ncomp, [=]
            AMREX_GPU_DEVICE (int i, int j, int k, int n) noexcept
            {
                if (!iconserv_ptr[n])
                {
                    Real q = xed(i,j,k,n) + xed(i+1,j,k,n)
                           + yed(i,j,k,n) + yed(i,j+1,k,n);
#if (AMREX_SPACEDIM == 2)
                    q *= 0.25;
#else
                    q += zed(i,j,k,n) + zed(i,j,k+1,n);
                    q /= 6.0;
#endif
                    advc_arr(i,j,k,n) += q*divu_arr(i,j,k);
                }
            });

        }
        else     // EB Godunov
        {
            AMREX_D_TERM(Array4<Real const> const& fcx = fcent[0]->const_array(mfi);,
                         Array4<Real const> const& fcy = fcent[1]->const_array(mfi);,
                         Array4<Real const> const& fcz = fcent[2]->const_array(mfi););

            AMREX_D_TERM(Array4<Real const> const& apx = areafrac[0]->const_array(mfi);,
                         Array4<Real const> const& apy = areafrac[1]->const_array(mfi);,
                         Array4<Real const> const& apz = areafrac[2]->const_array(mfi););

            Array4<Real const> const& ccent_arr = ccent.const_array(mfi);
            Array4<Real const> const& vfrac_arr = vfrac.const_array(mfi);
            auto const& flags_arr  = flags.const_array(mfi);

        //FIXME - compare to HydroUtils which hard codes 4 ghost cells for all
            int ngrow = 4;

            if (redistribution_type=="StateRedist")
                ++ngrow;

            FArrayBox tmpfab(amrex::grow(bx,ngrow),  (4*AMREX_SPACEDIM + 2)*ncomp);
            Elixir    eli = tmpfab.elixir();


            if (!known_edgestate)
            {
                EBGodunov::ComputeEdgeState( bx, ncomp,
                                             state.array(mfi,state_comp),
                                             AMREX_D_DECL( xed, yed, zed ),
                                             AMREX_D_DECL( u, v, w ),
                                             divu.array(mfi),
                                             fq.array(mfi,fq_comp),
                                             geom, dt, h_bc, d_bc,
                                             iconserv_ptr,
                                             tmpfab.dataPtr(),
                                             flags_arr,
                                             AMREX_D_DECL( apx, apy, apz ),
                                             vfrac_arr,
                                             AMREX_D_DECL( fcx, fcy, fcz ),
                                             ccent_arr,
                                             is_velocity,
                                             Array4<Real const>{} );
            }

            HydroUtils::EB_ComputeFluxes( bx,
                                          AMREX_D_DECL( fx, fy, fz ),
                                          AMREX_D_DECL( u, v, w ),
                                          AMREX_D_DECL( xed, yed, zed ),
                                          AMREX_D_DECL( apx, apy, apz ),
                                          geom, ncomp, flags_arr, fluxes_are_area_weighted );

            // div at ncomp*3 to make space for the 3 redistribute temporaries
            HydroUtils::EB_ComputeDivergence( bx,
                                              advc_arr,
                                              AMREX_D_DECL( fx, fy, fz ),
                                              vfrac_arr, ncomp, geom,
                                              mult, fluxes_are_area_weighted);

            // Compute the convective form if needed by accounting for extra term
            auto const& divu_arr  = divu_mac.array(mfi);
            amrex::ParallelFor(bx, ncomp, [=]
            AMREX_GPU_DEVICE (int i, int j, int k, int n) noexcept
            {
                if (!iconserv_ptr[n])
                {
          if ( vfrac_arr(i,j,k) != 0 )
                  {
                    Real q = xed(i,j,k,n)*apx(i,j,k) + xed(i+1,j,k,n)*apx(i+1,j,k)
                           + yed(i,j,k,n)*apy(i,j,k) + yed(i,j+1,k,n)*apy(i,j+1,k);
#if (AMREX_SPACEDIM == 2)
                    q /= (apx(i,j,k)+apx(i+1,j,k)+apy(i,j,k)+apy(i,j+1,k));
#else
                    q += zed(i,j,k,n)*apz(i,j,k) + zed(i,j,k+1,n)*apz(i,j,k+1);
                    q /= (apx(i,j,k)+apx(i+1,j,k)+apy(i,j,k)+apy(i,j+1,k)+apz(i,j,k)+apz(i,j,k+1));
#endif
                    advc_arr(i,j,k,n) += q*divu_arr(i,j,k);
          }
                 }
            });
      }
    }
    }

    advc.FillBoundary(geom.periodicity());

#ifdef _OPENMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
    for (MFIter mfi(aofs, TilingIfNotGPU()); mfi.isValid(); ++mfi)
    {
        auto const& bx = mfi.tilebox();

        auto const& flagfab = ebfact.getMultiEBCellFlagFab()[mfi];
        auto const& flag    = flagfab.const_array();
    auto const& aofs_arr = aofs.array(mfi, aofs_comp);
    auto const& advc_arr = advc.array(mfi);

        if (flagfab.getType(bx) != FabType::covered )
    {
      // FIXME? not sure if 4 is really needed or if 3 could do
      // But this is a safe choice
      if (flagfab.getType(grow(bx,4)) != FabType::regular)
      {
        //
        // Redistribute
        //
        AMREX_D_TERM( auto apx = ebfact.getAreaFrac()[0]->const_array(mfi);,
              auto apy = ebfact.getAreaFrac()[1]->const_array(mfi);,
              auto apz = ebfact.getAreaFrac()[2]->const_array(mfi); );

        AMREX_D_TERM( Array4<Real const> fcx = ebfact.getFaceCent()[0]->const_array(mfi);,
              Array4<Real const> fcy = ebfact.getFaceCent()[1]->const_array(mfi);,
              Array4<Real const> fcz = ebfact.getFaceCent()[2]->const_array(mfi););

        Array4<Real const> ccc = ebfact.getCentroid().const_array(mfi);
            Array4<Real const> const& vfrac_arr = vfrac.const_array(mfi);

        // This is scratch space if calling StateRedistribute,
            //  but is used as the weights (here set to 1) if calling
            //  FluxRedistribute
        Box gbx = bx;

        if (redistribution_type == "StateRedist")
          gbx.grow(3);
        else if (redistribution_type == "FluxRedist")
          gbx.grow(2);

        FArrayBox tmpfab(gbx, ncomp);
        Elixir eli = tmpfab.elixir();
            Array4<Real> scratch = tmpfab.array(0);
            if (redistribution_type == "FluxRedist")
            {
                amrex::ParallelFor(Box(scratch),
                [=] AMREX_GPU_DEVICE (int i, int j, int k) noexcept
                { scratch(i,j,k) = 1.;});
            }

        Redistribution::Apply( bx, ncomp, aofs_arr, advc.array(mfi),
                   state.const_array(mfi, state_comp), scratch, flag,
                                   AMREX_D_DECL(apx,apy,apz), vfrac_arr,
                   AMREX_D_DECL(fcx,fcy,fcz), ccc, d_bc,
                                   geom, dt, redistribution_type );

        // Change sign because we computed -div for all cases
        amrex::ParallelFor(bx, ncomp, [aofs_arr]
        AMREX_GPU_DEVICE (int i, int j, int k, int n) noexcept
        { aofs_arr( i, j, k, n ) *=  - 1.0; });
      }
      else
      {
        // Change sign because for EB we computed -div
            amrex::ParallelFor(bx, ncomp, [aofs_arr, advc_arr]
        AMREX_GPU_DEVICE (int i, int j, int k, int n) noexcept
        { aofs_arr( i, j, k, n ) =  -advc_arr(i,j,k,n); });
      }
    }
    }
}